

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createDeviceWithVariousQueueCountsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *this;
  deUint32 queueFamilyIndex;
  deUint32 dVar1;
  PlatformInterface *vkPlatform;
  VkResult value;
  VkPhysicalDevice physicalDevice;
  VkQueue queue;
  TestError *this_00;
  long lVar2;
  deUint32 queueCount;
  uint uVar3;
  deUint32 queueIndex;
  uint uVar4;
  deUint32 queueFamilyNdx;
  ulong uVar5;
  TestStatus *__return_storage_ptr___00;
  VkDeviceQueueCreateInfo *value_00;
  allocator<char> local_8d1;
  TestStatus *local_8d0;
  RefBase<vk::VkDevice_s_*> local_8c8;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  RefBase<vk::VkInstance_s_*> local_898;
  TestLog *local_880;
  ulong local_878;
  VkPhysicalDevice local_870;
  vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
  deviceQueueCreateInfos;
  vector<float,_std::allocator<float>_> queuePriorities;
  VkDeviceCreateInfo deviceCreateInfo;
  MessageBuilder local_7f0;
  InstanceDriver instanceDriver;
  VkDeviceQueueCreateInfo queueCreateInfo;
  
  vkPlatform = context->m_platformInterface;
  local_880 = context->m_testCtx->m_log;
  ::vk::createDefaultInstance((Move<vk::VkInstance_s_*> *)&queueCreateInfo,vkPlatform);
  local_898.m_data.deleter.m_allocator = (VkAllocationCallbacks *)queueCreateInfo._16_8_;
  local_898.m_data.object = (VkInstance_s *)queueCreateInfo._0_8_;
  local_898.m_data.deleter.m_destroyInstance = (DestroyInstanceFunc)queueCreateInfo.pNext;
  queueCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  queueCreateInfo._4_4_ = 0;
  queueCreateInfo.pNext = (void *)0x0;
  queueCreateInfo.flags = 0;
  queueCreateInfo.queueFamilyIndex = 0;
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase
            ((RefBase<vk::VkInstance_s_*> *)&queueCreateInfo);
  ::vk::InstanceDriver::InstanceDriver(&instanceDriver,vkPlatform,local_898.m_data.object);
  physicalDevice =
       ::vk::chooseDevice(&instanceDriver.super_InstanceInterface,local_898.m_data.object,
                          context->m_testCtx->m_cmdLine);
  ::vk::getPhysicalDeviceQueueFamilyProperties
            (&queueFamilyProperties,&instanceDriver.super_InstanceInterface,physicalDevice);
  uVar4 = 0;
  for (lVar2 = 0;
      (((long)queueFamilyProperties.
              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)queueFamilyProperties.
             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffffU) * 0x18 - lVar2 != 0;
      lVar2 = lVar2 + 0x18) {
    uVar3 = *(uint *)((long)&(queueFamilyProperties.
                              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start)->queueCount + lVar2);
    if (uVar4 <= uVar3) {
      uVar4 = uVar3;
    }
  }
  queueCreateInfo.sType = 0x3f800000;
  local_8d0 = __return_storage_ptr__;
  local_870 = physicalDevice;
  std::vector<float,_std::allocator<float>_>::vector
            (&queuePriorities,(ulong)uVar4,(value_type_conflict3 *)&queueCreateInfo,
             (allocator_type *)&local_7f0);
  deviceQueueCreateInfos.
  super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deviceQueueCreateInfos.
  super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deviceQueueCreateInfos.
  super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = 0;
  while( true ) {
    if ((((long)queueFamilyProperties.
                super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)queueFamilyProperties.
               super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffffU) <= uVar5) break;
    uVar4 = queueFamilyProperties.
            super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar5].queueCount;
    for (uVar3 = 1; uVar3 <= uVar4; uVar3 = uVar3 + 1) {
      queueCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
      queueCreateInfo.pNext = (void *)0x0;
      queueCreateInfo._16_8_ = uVar5 << 0x20;
      queueCreateInfo.pQueuePriorities =
           queuePriorities.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      queueCreateInfo.queueCount = uVar3;
      std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::
      push_back(&deviceQueueCreateInfos,&queueCreateInfo);
    }
    uVar5 = uVar5 + 1;
  }
  uVar5 = 0;
  do {
    if ((ulong)(((long)deviceQueueCreateInfos.
                       super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)deviceQueueCreateInfos.
                      super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= uVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&queueCreateInfo,"Pass",(allocator<char> *)&local_7f0);
      __return_storage_ptr___00 = local_8d0;
      tcu::TestStatus::pass(local_8d0,(string *)&queueCreateInfo);
      std::__cxx11::string::~string((string *)&queueCreateInfo);
LAB_004618c7:
      std::_Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::
      ~_Vector_base(&deviceQueueCreateInfos.
                     super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                   );
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&queuePriorities.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
      ~_Vector_base(&queueFamilyProperties.
                     super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                   );
      ::vk::InstanceDriver::~InstanceDriver(&instanceDriver);
      ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(&local_898);
      return __return_storage_ptr___00;
    }
    value_00 = deviceQueueCreateInfos.
               super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5;
    deviceCreateInfo.pNext = (void *)0x0;
    deviceCreateInfo.enabledExtensionCount = 0;
    deviceCreateInfo._52_4_ = 0;
    deviceCreateInfo.ppEnabledExtensionNames = (char **)0x0;
    deviceCreateInfo.pEnabledFeatures = (VkPhysicalDeviceFeatures *)0x0;
    deviceCreateInfo.enabledLayerCount = 0;
    deviceCreateInfo._36_4_ = 0;
    deviceCreateInfo.ppEnabledLayerNames = (char **)0x0;
    deviceCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
    deviceCreateInfo._4_4_ = 0;
    deviceCreateInfo.flags = 0;
    deviceCreateInfo.queueCreateInfoCount = 1;
    deviceCreateInfo.pQueueCreateInfos = value_00;
    ::vk::createDevice((Move<vk::VkDevice_s_*> *)&queueCreateInfo,
                       &instanceDriver.super_InstanceInterface,local_870,&deviceCreateInfo,
                       (VkAllocationCallbacks *)0x0);
    local_8c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)queueCreateInfo._16_8_;
    local_8c8.m_data.object = (VkDevice_s *)queueCreateInfo._0_8_;
    local_8c8.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)queueCreateInfo.pNext;
    queueCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    queueCreateInfo._4_4_ = 0;
    queueCreateInfo.pNext = (void *)0x0;
    queueCreateInfo.flags = 0;
    queueCreateInfo.queueFamilyIndex = 0;
    local_878 = uVar5;
    ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase
              ((RefBase<vk::VkDevice_s_*> *)&queueCreateInfo);
    ::vk::DeviceDriver::DeviceDriver
              ((DeviceDriver *)&queueCreateInfo,&instanceDriver.super_InstanceInterface,
               local_8c8.m_data.object);
    queueFamilyIndex = (deviceCreateInfo.pQueueCreateInfos)->queueFamilyIndex;
    dVar1 = (deviceCreateInfo.pQueueCreateInfos)->queueCount;
    for (queueIndex = 0; dVar1 != queueIndex; queueIndex = queueIndex + 1) {
      queue = ::vk::getDeviceQueue
                        ((DeviceInterface *)&queueCreateInfo,local_8c8.m_data.object,
                         queueFamilyIndex,queueIndex);
      if (queue == (VkQueue)0x0) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"!!queue",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                   ,0x264);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      value = ::vk::DeviceDriver::queueWaitIdle((DeviceDriver *)&queueCreateInfo,queue);
      if (value != VK_SUCCESS) {
        this = &local_7f0.m_str;
        local_7f0.m_log = local_880;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::operator<<((ostream *)this,"vkQueueWaitIdle failed");
        __return_storage_ptr___00 = local_8d0;
        std::operator<<((ostream *)this,",  queueIndex = ");
        std::ostream::_M_insert<unsigned_long>((ulong)this);
        std::operator<<((ostream *)this,", queueCreateInfo ");
        ::vk::operator<<((ostream *)this,value_00);
        std::operator<<((ostream *)this,", Error Code: ");
        ::vk::operator<<((ostream *)this,value);
        tcu::MessageBuilder::operator<<(&local_7f0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"Fail",&local_8d1);
        tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&local_7f0);
        std::__cxx11::string::~string((string *)&local_7f0);
        ::vk::DeviceDriver::~DeviceDriver((DeviceDriver *)&queueCreateInfo);
        ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_8c8);
        goto LAB_004618c7;
      }
    }
    ::vk::DeviceDriver::~DeviceDriver((DeviceDriver *)&queueCreateInfo);
    ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_8c8);
    uVar5 = local_878 + 1;
  } while( true );
}

Assistant:

tcu::TestStatus createDeviceWithVariousQueueCountsTest (Context& context)
{
	tcu::TestLog&							log						= context.getTestContext().getLog();
	const int								queueCountDiff			= 1;
	const PlatformInterface&				platformInterface		= context.getPlatformInterface();
	const Unique<VkInstance>				instance				(createDefaultInstance(platformInterface));
	const InstanceDriver					instanceDriver			(platformInterface, instance.get());
	const VkPhysicalDevice					physicalDevice			= chooseDevice(instanceDriver, instance.get(), context.getTestContext().getCommandLine());
	const vector<VkQueueFamilyProperties>	queueFamilyProperties	= getPhysicalDeviceQueueFamilyProperties(instanceDriver, physicalDevice);
	const vector<float>						queuePriorities			(getGlobalMaxQueueCount(queueFamilyProperties), 1.0f);
	vector<VkDeviceQueueCreateInfo>			deviceQueueCreateInfos;

	for (deUint32 queueFamilyNdx = 0; queueFamilyNdx < (deUint32)queueFamilyProperties.size(); queueFamilyNdx++)
	{
		const deUint32 maxQueueCount = queueFamilyProperties[queueFamilyNdx].queueCount;

		for (deUint32 queueCount = 1; queueCount <= maxQueueCount; queueCount += queueCountDiff)
		{
			const VkDeviceQueueCreateInfo queueCreateInfo =
			{
				VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,
				DE_NULL,
				(VkDeviceQueueCreateFlags)0u,
				queueFamilyNdx,
				queueCount,
				queuePriorities.data()
			};

			deviceQueueCreateInfos.push_back(queueCreateInfo);
		}
	}

	for (size_t testNdx = 0; testNdx < deviceQueueCreateInfos.size(); testNdx++)
	{
		const VkDeviceQueueCreateInfo&	queueCreateInfo		= deviceQueueCreateInfos[testNdx];
		const VkDeviceCreateInfo		deviceCreateInfo	=
		{
			VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,	//sType;
			DE_NULL,								//pNext;
			(VkDeviceCreateFlags)0u,
			1,										//queueRecordCount;
			&queueCreateInfo,						//pRequestedQueues;
			0,										//layerCount;
			DE_NULL,								//ppEnabledLayerNames;
			0,										//extensionCount;
			DE_NULL,								//ppEnabledExtensionNames;
			DE_NULL,								//pEnabledFeatures;
		};
		const Unique<VkDevice>			device				(createDevice(instanceDriver, physicalDevice, &deviceCreateInfo));
		const DeviceDriver				deviceDriver		(instanceDriver, device.get());
		const deUint32					queueFamilyIndex	= deviceCreateInfo.pQueueCreateInfos->queueFamilyIndex;
		const deUint32					queueCount			= deviceCreateInfo.pQueueCreateInfos->queueCount;

		for (deUint32 queueIndex = 0; queueIndex < queueCount; queueIndex++)
		{
			const VkQueue		queue	= getDeviceQueue(deviceDriver, *device, queueFamilyIndex, queueIndex);
			VkResult			result;

			TCU_CHECK(!!queue);

			result = deviceDriver.queueWaitIdle(queue);
			if (result != VK_SUCCESS)
			{
				log << TestLog::Message
					<< "vkQueueWaitIdle failed"
					<< ",  queueIndex = " << queueIndex
					<< ", queueCreateInfo " << queueCreateInfo
					<< ", Error Code: " << result
					<< TestLog::EndMessage;
				return tcu::TestStatus::fail("Fail");
			}
		}
	}
	return tcu::TestStatus::pass("Pass");
}